

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void list_account_details(int account_number)

{
  long *plVar1;
  long lVar2;
  bool bVar3;
  char *pcVar4;
  Account account;
  ifstream inFile;
  Account local_248;
  long local_228 [4];
  byte abStack_208 [488];
  
  local_248._vptr_Account = (_func_int **)&PTR_create_account_00107c80;
  std::ifstream::ifstream(local_228);
  std::ifstream::open((char *)local_228,0x10513d);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nBALANCE DETAILS\n",0x11);
    bVar3 = true;
    while( true ) {
      plVar1 = (long *)std::istream::read((char *)local_228,(long)&local_248);
      if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
      if (local_248.account_number == account_number) {
        bVar3 = false;
        Account::show_account(&local_248);
      }
    }
    std::ifstream::close();
    if (!bVar3) goto LAB_00103e72;
    lVar2 = 0x1f;
    pcVar4 = "\n\nAccount number does not exist";
  }
  else {
    lVar2 = 0x2a;
    pcVar4 = "File could not be open !! Press any Key...";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar2);
LAB_00103e72:
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void list_account_details(int account_number)
{
    /*!
     * It is a helper function that print details of account with th account_number
     */
    Account account;
    int flag=0;
    std::ifstream inFile;
    inFile.open("Account.dat",std::ios::binary);
    if(!inFile)
    {
        std::cout<<"File could not be open !! Press any Key...";
        return;
    }
    std::cout<<"\nBALANCE DETAILS\n";
    while(inFile.read((char *) &account, sizeof(Account)))
    {
        if(account.return_account_num()==account_number)
        {
            account.show_account();
            flag=1;
        }
    }
    inFile.close();
    if(flag==0)
        std::cout<<"\n\nAccount number does not exist";
}